

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_debug(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *local_148;
  size_t local_140;
  char buffer [250];
  
  fputs("lua_debug> ",_stderr);
  pcVar2 = fgets(buffer,0xfa,_stdin);
  while ((pcVar2 != (char *)0x0 && (iVar1 = bcmp(buffer,"cont\n",6), iVar1 != 0))) {
    local_140 = strlen(buffer);
    local_148 = buffer;
    iVar1 = lua_loadx(L,reader_string,&local_148,"=(debug command)",(char *)0x0);
    if ((iVar1 != 0) || (iVar1 = lua_pcall(L,0,0,0), iVar1 != 0)) {
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      fputs(pcVar2,_stderr);
      fputs("\n",_stderr);
    }
    lua_settop(L,0);
    fputs("lua_debug> ",_stderr);
    pcVar2 = fgets(buffer,0xfa,_stdin);
  }
  return 0;
}

Assistant:

LJLIB_CF(debug_debug)
{
  for (;;) {
    char buffer[250];
    fputs("lua_debug> ", stderr);
    if (fgets(buffer, sizeof(buffer), stdin) == 0 ||
	strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
	lua_pcall(L, 0, 0, 0)) {
      fputs(lua_tostring(L, -1), stderr);
      fputs("\n", stderr);
    }
    lua_settop(L, 0);  /* remove eventual returns */
  }
}